

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cc
# Opt level: O0

void __thiscall gimage::View::setCamera(View *this,Camera *c)

{
  Camera *pCVar1;
  long lVar2;
  undefined8 uVar3;
  long lVar4;
  Camera *in_RSI;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RDI;
  
  if (in_RSI == (Camera *)0x0) {
    if (*(long **)(in_RDI + 2) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 2) + 8))();
    }
    *(undefined8 *)(in_RDI + 2) = 0;
  }
  else {
    lVar2 = gmath::Camera::getWidth(in_RSI);
    if ((lVar2 < 1) || (lVar2 = gmath::Camera::getHeight(in_RSI), lVar2 < 1)) {
      if (*(long **)(in_RDI + 2) != (long *)0x0) {
        (**(code **)(**(long **)(in_RDI + 2) + 8))();
      }
      uVar3 = (**(code **)(*(long *)in_RSI + 0x10))();
      *(undefined8 *)(in_RDI + 2) = uVar3;
      lVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(in_RDI);
      if ((0 < lVar2) &&
         (lVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(in_RDI),
         0 < lVar2)) {
        pCVar1 = *(Camera **)(in_RDI + 2);
        lVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(in_RDI);
        lVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(in_RDI);
        gmath::Camera::setSize(pCVar1,lVar2,lVar4);
      }
      lVar2 = Image<float,_gimage::PixelTraits<float>_>::getWidth
                        ((Image<float,_gimage::PixelTraits<float>_> *)(in_RDI + 1));
      if ((0 < lVar2) &&
         (lVar2 = Image<float,_gimage::PixelTraits<float>_>::getHeight
                            ((Image<float,_gimage::PixelTraits<float>_> *)(in_RDI + 1)), 0 < lVar2))
      {
        pCVar1 = *(Camera **)(in_RDI + 2);
        lVar2 = Image<float,_gimage::PixelTraits<float>_>::getWidth
                          ((Image<float,_gimage::PixelTraits<float>_> *)(in_RDI + 1));
        lVar4 = Image<float,_gimage::PixelTraits<float>_>::getHeight
                          ((Image<float,_gimage::PixelTraits<float>_> *)(in_RDI + 1));
        gmath::Camera::setSize(pCVar1,lVar2,lVar4);
      }
    }
    else {
      lVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(in_RDI);
      if (0 < lVar2) {
        Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(in_RDI);
      }
      lVar2 = Image<float,_gimage::PixelTraits<float>_>::getWidth
                        ((Image<float,_gimage::PixelTraits<float>_> *)(in_RDI + 1));
      if (0 < lVar2) {
        Image<float,_gimage::PixelTraits<float>_>::getHeight
                  ((Image<float,_gimage::PixelTraits<float>_> *)(in_RDI + 1));
      }
      if (*(long **)(in_RDI + 2) != (long *)0x0) {
        (**(code **)(**(long **)(in_RDI + 2) + 8))();
      }
      uVar3 = (**(code **)(*(long *)in_RSI + 0x10))();
      *(undefined8 *)(in_RDI + 2) = uVar3;
    }
  }
  return;
}

Assistant:

void View::setCamera(const gmath::Camera *c)
{
  if (c == 0)
  {
    delete camera;
    camera=0;
    return;
  }

  if (c->getWidth() > 0 && c->getHeight() > 0)
  {
    // make sure that the size of the camera is the same as the size of the
    // images

    if (image.getWidth() > 0 && image.getHeight() > 0)
    {
      assert(c->getWidth() == image.getWidth());
      assert(c->getHeight() == image.getHeight());
    }

    if (depth.getWidth() > 0 && depth.getHeight() > 0)
    {
      assert(c->getWidth() == depth.getWidth());
      assert(c->getHeight() == depth.getHeight());
    }

    delete camera;
    camera=c->clone();
  }
  else
  {
    delete camera;
    camera=c->clone();

    // set size of camera from images if neccessary

    if (image.getWidth() > 0 && image.getHeight() > 0)
    {
      camera->setSize(image.getWidth(), image.getHeight());
    }

    if (depth.getWidth() > 0 && depth.getHeight() > 0)
    {
      camera->setSize(depth.getWidth(), depth.getHeight());
    }
  }
}